

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::SharedMemoryArbiterImpl::BindToProducerEndpoint
          (SharedMemoryArbiterImpl *this,ProducerEndpoint *producer_endpoint,TaskRunner *task_runner
          )

{
  uint uVar1;
  code *pcVar2;
  char *pcVar3;
  uint *puVar4;
  int *piVar5;
  char *pcVar6;
  bool bVar7;
  function<void_()> local_c0;
  function<void_()> local_a0;
  reference local_80;
  pair<const_unsigned_short,_unsigned_int> *entry;
  iterator __end2;
  iterator __begin2;
  map<unsigned_short,_unsigned_int,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_int>_>_>
  *__range2;
  lock_guard<std::mutex> local_50;
  lock_guard<std::mutex> scoped_lock;
  function<void_()> flush_callback;
  bool should_flush;
  TaskRunner *task_runner_local;
  ProducerEndpoint *producer_endpoint_local;
  SharedMemoryArbiterImpl *this_local;
  
  ::std::function<void_()>::function((function<void_()> *)&scoped_lock);
  ::std::lock_guard<std::mutex>::lock_guard(&local_50,(mutex_type *)&this->lock_);
  if ((this->fully_bound_ & 1U) != 0) {
    pcVar3 = perfetto::base::Basename
                       (
                       "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                       );
    puVar4 = (uint *)__errno_location();
    uVar1 = *puVar4;
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    perfetto::base::LogMessage
              (kLogError,pcVar3,0x97d4,"%s (errno: %d, %s)","PERFETTO_CHECK(!fully_bound_)",
               (ulong)uVar1,pcVar6);
    perfetto::base::MaybeSerializeLastLogsForCrashReporting();
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  bVar7 = false;
  if (this->producer_endpoint_ == (ProducerEndpoint *)0x0) {
    bVar7 = this->task_runner_ == (TaskRunner *)0x0;
  }
  if (!bVar7) {
    pcVar3 = perfetto::base::Basename
                       (
                       "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                       );
    puVar4 = (uint *)__errno_location();
    uVar1 = *puVar4;
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    perfetto::base::LogMessage
              (kLogError,pcVar3,0x97d5,"%s (errno: %d, %s)",
               "PERFETTO_CHECK(!producer_endpoint_ && !task_runner_)",(ulong)uVar1,pcVar6);
    perfetto::base::MaybeSerializeLastLogsForCrashReporting();
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  this->producer_endpoint_ = producer_endpoint;
  this->task_runner_ = task_runner;
  perfetto::base::WeakPtrFactory<perfetto::SharedMemoryArbiterImpl>::Reset
            (&this->weak_ptr_factory_,this);
  __end2 = std::
           map<unsigned_short,_unsigned_int,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_int>_>_>
           ::begin(&this->pending_writers_);
  entry = (pair<const_unsigned_short,_unsigned_int> *)
          std::
          map<unsigned_short,_unsigned_int,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_int>_>_>
          ::end(&this->pending_writers_);
  while( true ) {
    bVar7 = std::operator!=(&__end2,(_Self *)&entry);
    if (!bVar7) {
      bVar7 = UpdateFullyBoundLocked(this);
      if (bVar7) {
        TakePendingFlushCallbacksLocked(&local_a0,this);
        std::function<void_()>::operator=((function<void_()> *)&scoped_lock,&local_a0);
        ::std::function<void_()>::~function((function<void_()> *)&local_a0);
      }
      ::std::lock_guard<std::mutex>::~lock_guard(&local_50);
      if (bVar7) {
        ::std::function<void_()>::function(&local_c0,(function<void_()> *)&scoped_lock);
        (*(this->super_SharedMemoryArbiter)._vptr_SharedMemoryArbiter[0xb])(this,&local_c0);
        ::std::function<void_()>::~function(&local_c0);
      }
      ::std::function<void_()>::~function((function<void_()> *)&scoped_lock);
      return;
    }
    local_80 = std::_Rb_tree_iterator<std::pair<const_unsigned_short,_unsigned_int>_>::operator*
                         (&__end2);
    bVar7 = anon_unknown_4::IsReservationTargetBufferId(local_80->second);
    if (((bVar7 ^ 0xffU) & 1) != 0) break;
    std::_Rb_tree_iterator<std::pair<const_unsigned_short,_unsigned_int>_>::operator++(&__end2);
  }
  pcVar3 = perfetto::base::Basename
                     (
                     "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                     );
  puVar4 = (uint *)__errno_location();
  uVar1 = *puVar4;
  piVar5 = __errno_location();
  pcVar6 = strerror(*piVar5);
  perfetto::base::LogMessage
            (kLogError,pcVar3,0x97e3,"%s (errno: %d, %s)",
             "PERFETTO_CHECK(IsReservationTargetBufferId(entry.second))",(ulong)uVar1,pcVar6);
  perfetto::base::MaybeSerializeLastLogsForCrashReporting();
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

void SharedMemoryArbiterImpl::BindToProducerEndpoint(
    TracingService::ProducerEndpoint* producer_endpoint,
    base::TaskRunner* task_runner) {
  PERFETTO_DCHECK(producer_endpoint && task_runner);
  PERFETTO_DCHECK(task_runner->RunsTasksOnCurrentThread());

  bool should_flush = false;
  std::function<void()> flush_callback;
  {
    std::lock_guard<std::mutex> scoped_lock(lock_);
    PERFETTO_CHECK(!fully_bound_);
    PERFETTO_CHECK(!producer_endpoint_ && !task_runner_);

    producer_endpoint_ = producer_endpoint;
    task_runner_ = task_runner;

    // Now that we're bound to a task runner, also reset the WeakPtrFactory to
    // it. Because this code runs on the task runner, the factory's weak
    // pointers will be valid on it.
    weak_ptr_factory_.Reset(this);

    // All writers registered so far should be startup trace writers, since
    // the producer cannot feasibly know the target buffer for any future
    // session yet.
    for (const auto& entry : pending_writers_) {
      PERFETTO_CHECK(IsReservationTargetBufferId(entry.second));
    }

    // If all buffer reservations are bound, we can flush pending commits.
    if (UpdateFullyBoundLocked()) {
      should_flush = true;
      flush_callback = TakePendingFlushCallbacksLocked();
    }
  }  // scoped_lock

  // Attempt to flush any pending commits (and run pending flush callbacks). If
  // there are none, this will have no effect. If we ended up in a race that
  // changed |fully_bound_| back to false, the commit will happen once we become
  // |fully_bound_| again.
  if (should_flush)
    FlushPendingCommitDataRequests(flush_callback);
}